

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O3

ostream * ccs::operator<<(ostream *out,Key *key)

{
  bool bVar1;
  undefined8 in_RAX;
  ostream *poVar2;
  _Rb_tree_node_base *p_Var3;
  _Base_ptr p_Var4;
  _Rb_tree_header *p_Var5;
  undefined8 uStack_38;
  
  p_Var4 = (key->values_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(key->values_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 != p_Var5) {
    bVar1 = true;
    uStack_38 = in_RAX;
    do {
      if (!bVar1) {
        uStack_38._0_7_ = CONCAT16(0x2f,(undefined6)uStack_38);
        std::__ostream_insert<char,std::char_traits<char>>(out,(char *)((long)&uStack_38 + 6),1);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                (out,*(char **)(p_Var4 + 1),(long)p_Var4[1]._M_parent);
      for (p_Var3 = p_Var4[2]._M_right; p_Var3 != (_Rb_tree_node_base *)&p_Var4[2]._M_parent;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        uStack_38 = CONCAT17(0x2e,(undefined7)uStack_38);
        poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,(char *)((long)&uStack_38 + 7),1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar2,*(char **)(p_Var3 + 1),(long)p_Var3[1]._M_parent);
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      bVar1 = false;
    } while ((_Rb_tree_header *)p_Var4 != p_Var5);
  }
  return out;
}

Assistant:

std::ostream &operator<<(std::ostream &out, const Key &key) {
  bool first = true;
  for (auto it = key.values_.cbegin(); it != key.values_.cend(); ++it) {
    if (!first) out << '/';
    out << it->first;
    for (auto it2 = it->second.cbegin(); it2 != it->second.cend(); ++it2) {
      // MMH the java version checks to see if *it2 is actually an ident, and
      // if not, quotes/escapes it. a nice touch, but maybe more trouble than
      // it's worth.
      //if (identRegex.matcher(*it2).matches())
      out << '.' << *it2;
      //else
      //  out << ".'" << v.replace("'", "\\'") << '\'';
    }
    first = false;
  }
  return out;
}